

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool SingleTreeSearchHelperBool
               (ON_RTreeNode *a_nodeA,ON_RTreeBranch *a_branchB,
               ON_RTreePairSearchCallbackResultBool *a_result)

{
  ON_RTreeBranch *a_rectA;
  int iVar1;
  bool bVar2;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar3;
  ON_RTreeNode *pOVar4;
  bool bVar5;
  
  iVar1 = a_nodeA->m_count;
  pOVar4 = a_nodeA;
  if (a_nodeA->m_level < 1) {
    do {
      paVar3 = &pOVar4->m_branch[0].field_1;
      a_rectA = pOVar4->m_branch;
      bVar5 = a_nodeA->m_branch + iVar1 <= a_rectA;
      if (bVar5) {
        return bVar5;
      }
      pOVar4 = (ON_RTreeNode *)paVar3;
    } while (((a_branchB <= a_rectA) ||
             (bVar2 = PairSearchOverlapHelper
                                (&a_rectA->m_rect,&a_branchB->m_rect,a_result->m_tolerance), !bVar2)
             ) || (bVar2 = (*a_result->m_resultCallbackBool)
                                     (a_result->m_context,(ON__INT_PTR)paVar3->m_child,
                                      (ON__INT_PTR)(a_branchB->field_1).m_child), bVar2));
  }
  else {
    do {
      paVar3 = &pOVar4->m_branch[0].field_1;
      bVar5 = a_nodeA->m_branch + iVar1 <= pOVar4->m_branch;
      if (bVar5) {
        return bVar5;
      }
      bVar2 = PairSearchOverlapHelper
                        (&pOVar4->m_branch[0].m_rect,&a_branchB->m_rect,a_result->m_tolerance);
      pOVar4 = (ON_RTreeNode *)paVar3;
    } while ((!bVar2) ||
            (bVar2 = SingleTreeSearchHelperBool(paVar3->m_child,a_branchB,a_result), bVar2));
  }
  return bVar5;
}

Assistant:

static bool SingleTreeSearchHelperBool(const ON_RTreeNode* a_nodeA, const ON_RTreeBranch* a_branchB, ON_RTreePairSearchCallbackResultBool* a_result)
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchA, *branchAmax;

  branchA = a_nodeA->m_branch;
  branchAmax = branchA + a_nodeA->m_count;

  if (a_nodeA->m_level > 0)
  {
    // branchA's have children nodes and a_branchB is a leaf
    while (branchA < branchAmax)
    {
      if (PairSearchOverlapHelper(&branchA->m_rect, &a_branchB->m_rect, a_result->m_tolerance))
      {
        if (!SingleTreeSearchHelperBool(branchA->m_child, a_branchB, a_result))
          return false;
      }
      branchA++;
    }
  }
  else
  {
    // branchA's are all leaves
    while (branchA < branchAmax)
    {
      if (branchA < a_branchB)
      {
        if (PairSearchOverlapHelper(&branchA->m_rect, &a_branchB->m_rect, a_result->m_tolerance))
        {
          if (!a_result->m_resultCallbackBool(a_result->m_context, branchA->m_id, a_branchB->m_id))
            return false;
        }
      }
      branchA++;
    }
  }

  return true;
}